

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O2

int Abc_TtIsSubsetWithMask(word *pSmall,word *pLarge,word *pMask,int nWords)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  uVar4 = (ulong)(uint)nWords;
  if (nWords < 1) {
    uVar4 = uVar5;
  }
  do {
    if (uVar4 == uVar5) {
      return 1;
    }
    puVar1 = pLarge + uVar5;
    puVar2 = pSmall + uVar5;
    puVar3 = pMask + uVar5;
    uVar5 = uVar5 + 1;
  } while ((*puVar3 & ~*puVar1 & *puVar2) == 0);
  return 0;
}

Assistant:

static int Abc_TtIsSubsetWithMask( word * pSmall, word * pLarge, word * pMask, int nWords )
{
    int w;
    for ( w = 0; w < nWords; ++w )
        if ( ( pSmall[w] & pLarge[w] & pMask[w] ) != ( pSmall[w] & pMask[w] ) )
            return 0;
    return 1;
}